

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenNumType(Lexer *this,uint64_t num)

{
  bool bVar1;
  int iVar2;
  Position local_218;
  undefined1 local_1fa [18];
  Position local_1e8;
  Position local_1d0;
  undefined1 local_1b8 [46];
  undefined1 local_18a [40];
  undefined1 local_162 [40];
  undefined1 local_13a [40];
  undefined1 local_112 [40];
  undefined1 local_ea [40];
  undefined1 local_c2 [40];
  undefined1 local_9a [40];
  undefined1 local_72 [10];
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> local_68;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> tok;
  Position local_48;
  Position local_30;
  uint64_t num_local;
  Lexer *this_local;
  
  num_local = num;
  this_local = this;
  iVar2 = isdigit(*(int *)(num + 0xb0));
  if (iVar2 == 0) {
    std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
    unique_ptr<std::default_delete<pfederc::Token>,void>
              ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
               (nullptr_t)0x0);
    switch(*(undefined4 *)(num + 0xb0)) {
    case 0x4c:
      nextChar((Lexer *)num);
      local_18a._0_2_ = 9;
      getCurrentCursor((Position *)(local_1b8 + 0x10),(Lexer *)num);
      std::
      make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                ((Token **)(local_18a + 2),(TokenType *)(num + 0xb8),(Position *)local_18a,
                 (unsigned_long *)(local_1b8 + 0x10));
      std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                 (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_18a + 2));
      std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::~unique_ptr
                ((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_18a + 2));
      break;
    default:
      break;
    case 0x53:
      nextChar((Lexer *)num);
      local_162._0_2_ = 7;
      getCurrentCursor((Position *)(local_18a + 10),(Lexer *)num);
      std::
      make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                ((Token **)(local_162 + 2),(TokenType *)(num + 0xb8),(Position *)local_162,
                 (unsigned_long *)(local_18a + 10));
      std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                 (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_162 + 2));
      std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::~unique_ptr
                ((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_162 + 2));
      break;
    case 0x6c:
      nextChar((Lexer *)num);
      break;
    case 0x73:
      nextChar((Lexer *)num);
      local_13a._0_2_ = 6;
      getCurrentCursor((Position *)(local_162 + 10),(Lexer *)num);
      std::
      make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                ((Token **)(local_13a + 2),(TokenType *)(num + 0xb8),(Position *)local_13a,
                 (unsigned_long *)(local_162 + 10));
      std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                 (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_13a + 2));
      std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::~unique_ptr
                ((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_13a + 2));
      break;
    case 0x75:
      iVar2 = nextChar((Lexer *)num);
      switch(iVar2) {
      case 0x4c:
        nextChar((Lexer *)num);
        local_ea._0_2_ = 0xd;
        getCurrentCursor((Position *)(local_112 + 10),(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                  ((Token **)(local_ea + 2),(TokenType *)(num + 0xb8),(Position *)local_ea,
                   (unsigned_long *)(local_112 + 10));
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                   (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                   (local_ea + 2));
        std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
        ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                    (local_ea + 2));
        break;
      default:
        iVar2 = isalnum(*(int *)(num + 0xb0));
        if (iVar2 == 0) {
          local_112._0_2_ = 0xc;
          getCurrentCursor((Position *)(local_13a + 10),(Lexer *)num);
          std::
          make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                    ((Token **)(local_112 + 2),(TokenType *)(num + 0xb8),(Position *)local_112,
                     (unsigned_long *)(local_13a + 10));
          std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                    ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                     (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *
                     )(local_112 + 2));
          std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
          ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>
                       *)(local_112 + 2));
        }
        break;
      case 0x53:
        nextChar((Lexer *)num);
        local_9a._0_2_ = 0xb;
        getCurrentCursor((Position *)(local_c2 + 10),(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                  ((Token **)(local_9a + 2),(TokenType *)(num + 0xb8),(Position *)local_9a,
                   (unsigned_long *)(local_c2 + 10));
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                   (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                   (local_9a + 2));
        std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
        ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                    (local_9a + 2));
        break;
      case 0x6c:
        nextChar((Lexer *)num);
        local_c2._0_2_ = 0xc;
        getCurrentCursor((Position *)(local_ea + 10),(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                  ((Token **)(local_c2 + 2),(TokenType *)(num + 0xb8),(Position *)local_c2,
                   (unsigned_long *)(local_ea + 10));
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                   (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                   (local_c2 + 2));
        std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
        ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                    (local_c2 + 2));
        break;
      case 0x73:
        nextChar((Lexer *)num);
        local_72._0_2_ = 10;
        getCurrentCursor((Position *)(local_9a + 10),(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                  ((Token **)(local_72 + 2),(TokenType *)(num + 0xb8),(Position *)local_72,
                   (unsigned_long *)(local_9a + 10));
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_68,
                   (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                   (local_72 + 2));
        std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
        ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                    (local_72 + 2));
      }
    }
    iVar2 = isalnum(*(int *)(num + 0xb0));
    if (iVar2 == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
      if (bVar1) {
        std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::unique_ptr
                  ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)this,
                   &local_68);
      }
      else {
        local_1fa._0_2_ = 8;
        getCurrentCursor(&local_218,(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,unsigned_long&>
                  ((Token **)(local_1fa + 2),(TokenType *)(num + 0xb8),(Position *)local_1fa,
                   &local_218.line);
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
        unique_ptr<pfederc::NumberToken,std::default_delete<pfederc::NumberToken>,void>
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)this,
                   (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                   (local_1fa + 2));
        std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
        ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                    (local_1fa + 2));
      }
    }
    else {
      local_1b8._6_2_ = 2;
      local_1b8._0_4_ = 9;
      getCurrentCursor(&local_1e8,(Lexer *)num);
      Position::Position(&local_1d0,local_1e8.line,*(size_t *)(num + 0xa8),*(size_t *)(num + 0xa8));
      std::
      make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                ((Level *)(local_1b8 + 8),(LexerErrorCode *)(local_1b8 + 6),(Position *)local_1b8);
      generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                          *)num);
      std::
      unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                     *)(local_1b8 + 8));
    }
    local_1fa._14_4_ = 1;
    std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::~unique_ptr(&local_68);
  }
  else {
    local_30.line._6_2_ = 2;
    local_30.line._0_4_ = 8;
    getCurrentCursor((Position *)&tok,(Lexer *)num);
    Position::Position(&local_48,
                       (size_t)tok._M_t.
                               super___uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_>
                               .super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl,
                       *(size_t *)(num + 0xa8),*(size_t *)(num + 0xa8));
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)&local_30.startIndex,(LexerErrorCode *)((long)&local_30.line + 6),&local_30)
    ;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)&local_30.startIndex);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenNumType(std::uint64_t num) noexcept {
  if (isdigit(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  std::unique_ptr<Token> tok(nullptr);
  switch (currentChar) {
  case 'u':
    switch (nextChar()) {
      case 's':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT8,
          getCurrentCursor(), num);
        break;
      case 'S':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT16,
          getCurrentCursor(), num);
        break;
      case 'l':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT32,
          getCurrentCursor(), num);
        break;
      case 'L':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT64,
          getCurrentCursor(), num);
        break;
      default:
        if (!isalnum(currentChar))
          tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT32,
            getCurrentCursor(), num);
        break;
    }
    break;
  case 's':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT8,
      getCurrentCursor(), num);
    break;
  case 'S':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT16,
      getCurrentCursor(), num);
    break;
  case 'l':
    nextChar();
    break;
  case 'L':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT64,
      getCurrentCursor(), num);
    break;
  default:
    break;
  }

  if (isalnum(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  if (!tok)
    return std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT32,
      getCurrentCursor(), num);

  return tok;
}